

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_accv(int datatype,void *scale,comex_giov_t *iov,int iov_len,int proc,comex_group_t group)

{
  int iVar1;
  int in_ECX;
  long in_RDX;
  undefined8 in_RSI;
  undefined4 in_R9D;
  int count;
  int bytes;
  void **dst;
  void **src;
  int j;
  int i;
  undefined8 uVar2;
  void *dst_ptr;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar3;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < in_ECX; iVar4 = iVar4 + 1) {
    dst_ptr = *(void **)(in_RDX + (long)iVar4 * 0x18);
    uVar2 = *(undefined8 *)(in_RDX + (long)iVar4 * 0x18 + 8);
    iVar1 = *(int *)(in_RDX + (long)iVar4 * 0x18 + 0x10);
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      comex_acc(in_ECX,(void *)CONCAT44(in_R9D,iVar4),
                (void *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),dst_ptr,
                (int)((ulong)uVar2 >> 0x20),(int)uVar2,(comex_group_t)in_RSI);
    }
  }
  return 0;
}

Assistant:

int comex_accv(
        int datatype, void *scale,
        comex_giov_t *iov, int iov_len,
        int proc, comex_group_t group)
{
    int i;
    for (i=0; i<iov_len; ++i) {
        int j;
        void **src = iov[i].src;
        void **dst = iov[i].dst;
        int bytes = iov[i].bytes;
        int count = iov[i].count;
        for (j=0; j<count; ++j) {
            comex_acc(datatype, scale, src[j], dst[j], bytes, proc, group);
        }
    }
    return COMEX_SUCCESS;
}